

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpacking.cpp
# Opt level: O0

void __thiscall
duckdb::BitpackingState<duckdb::hugeint_t,_duckdb::hugeint_t>::Reset
          (BitpackingState<duckdb::hugeint_t,_duckdb::hugeint_t> *this)

{
  long in_RDI;
  hugeint_t hVar1;
  int64_t in_stack_ffffffffffffff88;
  hugeint_t *in_stack_ffffffffffffff90;
  undefined8 local_68;
  undefined8 local_60;
  undefined8 local_58;
  undefined8 local_50;
  undefined8 local_48;
  undefined8 local_40;
  undefined8 local_38;
  undefined8 local_30;
  undefined8 local_28;
  undefined8 local_20;
  undefined8 local_18;
  undefined8 local_10;
  
  hVar1 = NumericLimits<duckdb::hugeint_t>::Maximum();
  local_18 = hVar1.lower;
  *(uint64_t *)(in_RDI + 0x10830) = local_18;
  local_10 = hVar1.upper;
  *(int64_t *)(in_RDI + 0x10838) = local_10;
  hVar1 = NumericLimits<duckdb::hugeint_t>::Maximum();
  local_28 = hVar1.lower;
  *(uint64_t *)(in_RDI + 0x10860) = local_28;
  local_20 = hVar1.upper;
  *(int64_t *)(in_RDI + 0x10868) = local_20;
  hVar1 = NumericLimits<duckdb::hugeint_t>::Minimum();
  local_38 = hVar1.lower;
  *(uint64_t *)(in_RDI + 0x10840) = local_38;
  local_30 = hVar1.upper;
  *(int64_t *)(in_RDI + 0x10848) = local_30;
  hVar1 = NumericLimits<duckdb::hugeint_t>::Minimum();
  local_48 = hVar1.lower;
  *(uint64_t *)(in_RDI + 0x10870) = local_48;
  local_40 = hVar1.upper;
  *(int64_t *)(in_RDI + 0x10878) = local_40;
  hugeint_t::hugeint_t(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
  *(undefined8 *)(in_RDI + 0x10890) = local_58;
  *(undefined8 *)(in_RDI + 0x10898) = local_50;
  *(undefined1 *)(in_RDI + 0x108a0) = 1;
  *(undefined1 *)(in_RDI + 0x108a1) = 1;
  *(undefined1 *)(in_RDI + 0x108a2) = 0;
  *(undefined1 *)(in_RDI + 0x108a3) = 0;
  *(undefined8 *)(in_RDI + 0x10818) = 0;
  hugeint_t::hugeint_t(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
  *(undefined8 *)(in_RDI + 0x10850) = local_68;
  *(undefined8 *)(in_RDI + 0x10858) = local_60;
  hugeint_t::hugeint_t(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
  *(int64_t *)(in_RDI + 0x10880) = in_stack_ffffffffffffff88;
  *(hugeint_t **)(in_RDI + 0x10888) = in_stack_ffffffffffffff90;
  return;
}

Assistant:

void Reset() {
		minimum = NumericLimits<T>::Maximum();
		minimum_delta = NumericLimits<T_S>::Maximum();
		maximum = NumericLimits<T>::Minimum();
		maximum_delta = NumericLimits<T_S>::Minimum();
		delta_offset = 0;
		all_valid = true;
		all_invalid = true;
		can_do_delta = false;
		can_do_for = false;
		compression_buffer_idx = 0;
		min_max_diff = 0;
		min_max_delta_diff = 0;
	}